

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_IHDR(ucvector *out,uint w,uint h,LodePNGColorType colortype,uint bitdepth,
                  uint interlace_method)

{
  undefined1 in_CL;
  uint in_EDX;
  uint in_ESI;
  undefined1 in_R8B;
  undefined4 in_R9D;
  uint error;
  uchar *data;
  uchar *chunk;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  size_t in_stack_ffffffffffffffc8;
  size_t *buffer;
  ucvector *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined1 uVar1;
  uint local_4;
  
  local_4 = lodepng_chunk_init((uchar **)CONCAT44(in_R9D,in_stack_ffffffffffffffd8),
                               in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                               (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                              );
  uVar1 = (undefined1)in_R9D;
  if (local_4 == 0) {
    buffer = &in_stack_ffffffffffffffd0->size;
    lodepng_set32bitInt((uchar *)buffer,in_ESI);
    lodepng_set32bitInt((uchar *)((long)buffer + 4),in_EDX);
    *(undefined1 *)(buffer + 1) = in_R8B;
    *(undefined1 *)((long)buffer + 9) = in_CL;
    *(undefined1 *)((long)buffer + 10) = 0;
    *(undefined1 *)((long)buffer + 0xb) = 0;
    *(undefined1 *)((long)buffer + 0xc) = uVar1;
    lodepng_chunk_generate_crc((uchar *)CONCAT44(local_4,in_stack_ffffffffffffffc0));
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static unsigned addChunk_IHDR(ucvector* out, unsigned w, unsigned h,
                              LodePNGColorType colortype, unsigned bitdepth, unsigned interlace_method) {
  unsigned char *chunk, *data;
  CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 13, "IHDR"));
  data = chunk + 8;

  lodepng_set32bitInt(data + 0, w); /*width*/
  lodepng_set32bitInt(data + 4, h); /*height*/
  data[8] = (unsigned char)bitdepth; /*bit depth*/
  data[9] = (unsigned char)colortype; /*color type*/
  data[10] = 0; /*compression method*/
  data[11] = 0; /*filter method*/
  data[12] = interlace_method; /*interlace method*/

  lodepng_chunk_generate_crc(chunk);
  return 0;
}